

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

size_t fct_ts__tst_cnt_passed(fct_ts_t *ts)

{
  size_t sVar1;
  uint uVar2;
  fct_test_t *test;
  size_t idx;
  size_t sVar3;
  
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x52a
                  ,"size_t fct_ts__tst_cnt_passed(const fct_ts_t *)");
  }
  if (ts->mode == ts_mode_end) {
    sVar1 = (ts->test_list).used_itm_num;
    sVar3 = 0;
    for (idx = 0; sVar1 != idx; idx = idx + 1) {
      test = (fct_test_t *)fct_nlist__at(&ts->test_list,idx);
      uVar2 = fct_test__is_pass(test);
      sVar3 = sVar3 + uVar2;
    }
    return sVar3;
  }
  __assert_fail("((ts)->mode == ts_mode_end)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x52b,
                "size_t fct_ts__tst_cnt_passed(const fct_ts_t *)");
}

Assistant:

static size_t
fct_ts__tst_cnt_passed(fct_ts_t const *ts)
{
    size_t tally =0;

    FCT_ASSERT( ts != NULL );
    FCT_ASSERT( fct_ts__is_end(ts) );

    FCT_NLIST_FOREACH_BGN(fct_test_t*, test, &(ts->test_list))
    {
        if ( fct_test__is_pass(test) )
        {
            tally += 1;
        }
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}